

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_resume_normal_shape(player *p)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  player_shape *ppVar3;
  
  ppVar3 = lookup_player_shape("normal");
  p->shape = ppVar3;
  msg("You resume your usual shape.");
  player_clear_timed(p,L'*',true,false);
  ppVar2 = p->upkeep;
  uVar1._0_4_ = ppVar2->update;
  uVar1._4_4_ = ppVar2->redraw;
  ppVar2->update = (int)(uVar1 | 0x300000001);
  ppVar2->redraw = (int)((uVar1 | 0x300000001) >> 0x20);
  handle_stuff(p);
  return;
}

Assistant:

void player_resume_normal_shape(struct player *p)
{
	p->shape = lookup_player_shape("normal");
	msg("You resume your usual shape.");

	/* Kill vampire attack */
	(void) player_clear_timed(p, TMD_ATT_VAMP, true, false);

	/* Update */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->redraw |= (PR_TITLE | PR_MISC);
	handle_stuff(p);
}